

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O2

void __thiscall
BayesianGameForDecPOMDPStage::~BayesianGameForDecPOMDPStage(BayesianGameForDecPOMDPStage *this)

{
  pointer ppJVar1;
  pointer ppJVar2;
  
  (this->super_BayesianGameForDecPOMDPStageInterface)._vptr_BayesianGameForDecPOMDPStageInterface =
       (_func_int **)&PTR__BayesianGameForDecPOMDPStage_005d8458;
  (this->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
  super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
  super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&PTR__BayesianGameForDecPOMDPStage_005d84a8;
  ppJVar1 = (this->_m_JBs).
            super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppJVar2 = (this->_m_JBs).
                 super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppJVar2 != ppJVar1;
      ppJVar2 = ppJVar2 + 1) {
    if (*ppJVar2 != (JointBeliefInterface *)0x0) {
      (**(code **)((long)**ppJVar2 + 8))();
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->_m_immR);
  std::_Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::~_Vector_base
            (&(this->_m_JBs).
              super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>);
  BayesianGameIdenticalPayoff::~BayesianGameIdenticalPayoff
            (&this->super_BayesianGameIdenticalPayoff);
  BayesianGameForDecPOMDPStageInterface::~BayesianGameForDecPOMDPStageInterface
            (&this->super_BayesianGameForDecPOMDPStageInterface);
  return;
}

Assistant:

BayesianGameForDecPOMDPStage::~BayesianGameForDecPOMDPStage()
{
    //free all the joint beliefs:
    std::vector< JointBeliefInterface* >::iterator it =  _m_JBs.begin();
    std::vector< JointBeliefInterface* >::iterator last =  _m_JBs.end();
    while(it != last)
    {
        delete *it;
        it++;
    }
}